

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void anon_unknown.dwarf_1505e78::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               bitmask<slang::ast::InstanceFlags> flags,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  char *pcVar1;
  undefined1 *this;
  undefined1 *puVar2;
  SyntaxKind SVar3;
  SyntaxNode *expr;
  IdentifierNameSyntax *pIVar4;
  byte bVar5;
  size_t __n;
  char *__s1;
  int iVar6;
  uint uVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  size_type __rlen;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  size_t pos;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNets;
  locator res;
  ASTContext ctx;
  string_view local_170;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *local_160;
  ulong local_158;
  uint64_t local_150;
  IdentifierNameSyntax *local_148;
  ulong local_140;
  HierarchicalInstanceSyntax *local_138;
  arrays_type *local_130;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_128;
  NetType *local_120;
  Compilation *local_118;
  ulong local_110;
  char *local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> local_e0 [2];
  locator local_a0;
  char local_88;
  char cStack_87;
  char cStack_86;
  byte bStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  byte bStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  byte bStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  byte bStack_79;
  char local_78;
  char cStack_77;
  char cStack_76;
  byte bStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  byte bStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  byte bStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  byte bStack_69;
  ASTContext local_68;
  
  if (netType->netKind != Unknown) {
    local_68.assertionInstance = context->assertionInstance;
    local_68.scope.ptr = (context->scope).ptr;
    local_68.lookupIndex = context->lookupIndex;
    local_68._12_4_ = *(undefined4 *)&context->field_0xc;
    local_68.flags.m_bits._0_1_ = (undefined1)(context->flags).m_bits;
    local_68.flags.m_bits._1_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 1);
    local_68.flags.m_bits._2_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 2);
    local_68.flags.m_bits._3_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 3);
    local_68.flags.m_bits._4_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 4);
    local_68.flags.m_bits._5_1_ = *(byte *)((long)&(context->flags).m_bits + 5);
    local_68.flags.m_bits._6_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 6);
    local_68.flags.m_bits._7_1_ = *(undefined1 *)((long)&(context->flags).m_bits + 7);
    local_68.instanceOrProc._0_1_ = *(undefined1 *)&context->instanceOrProc;
    local_68.instanceOrProc._1_1_ = *(undefined1 *)((long)&context->instanceOrProc + 1);
    local_68.instanceOrProc._2_1_ = *(undefined1 *)((long)&context->instanceOrProc + 2);
    local_68.instanceOrProc._3_1_ = *(undefined1 *)((long)&context->instanceOrProc + 3);
    local_68.instanceOrProc._4_1_ = *(undefined1 *)((long)&context->instanceOrProc + 4);
    local_68.instanceOrProc._5_1_ = *(undefined1 *)((long)&context->instanceOrProc + 5);
    local_68.instanceOrProc._6_1_ = *(undefined1 *)((long)&context->instanceOrProc + 6);
    local_68.instanceOrProc._7_1_ = *(undefined1 *)((long)&context->instanceOrProc + 7);
    local_68.firstTempVar = context->firstTempVar;
    local_68.randomizeDetails = context->randomizeDetails;
    if ((flags.m_bits & 2) != 0) {
      local_68.flags.m_bits._5_1_ = local_68.flags.m_bits._5_1_ | 0x10;
    }
    local_158 = (instance->connections).elements._M_extent._M_extent_value + 1;
    if (1 < local_158) {
      local_158 = local_158 >> 1;
      this = &(implicitNetNames->super_Storage).field_0x88;
      local_130 = (arrays_type *)&implicitNetNames->field_0x90;
      uVar12 = 0;
      local_160 = implicitNetNames;
      local_138 = instance;
      local_128 = results;
      local_120 = netType;
      do {
        ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((instance->connections).elements._M_ptr + uVar12 * 2));
        SVar3 = (*ppSVar8)->kind;
        if (SVar3 == OrderedPortConnection) {
          lVar9 = 0x50;
LAB_003bf11f:
          expr = *(SyntaxNode **)((long)&(*ppSVar8)->kind + lVar9);
          if (expr != (SyntaxNode *)0x0) {
            local_e0[0].data_ = (pointer)local_e0[0].firstElement;
            local_e0[0].len = 0;
            local_e0[0].cap = 5;
            slang::ast::Expression::findPotentiallyImplicitNets(expr,&local_68,local_e0);
            if (local_e0[0].len != 0) {
              local_118 = (local_68.scope.ptr)->compilation;
              local_108 = (char *)((long)local_e0[0].data_ + local_e0[0].len * 8);
              pcVar10 = (char *)local_e0[0].data_;
              do {
                pIVar4 = *(IdentifierNameSyntax **)pcVar10;
                local_170 = slang::parsing::Token::valueText(&pIVar4->identifier);
                local_148 = pIVar4;
                local_150 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                            ::operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                          *)this,&local_170);
                uVar11 = local_150 >> (implicitNetNames->field_0x90 & 0x3f);
                local_f0 = *(long *)&implicitNetNames->field_0xa0;
                lVar9 = (local_150 & 0xff) * 4;
                cVar15 = (&UNK_00461acc)[lVar9];
                cVar16 = (&UNK_00461acd)[lVar9];
                cVar17 = (&UNK_00461ace)[lVar9];
                bVar18 = (&UNK_00461acf)[lVar9];
                local_e8 = *(long *)&implicitNetNames->field_0xa8;
                __n = local_170._M_len;
                __s1 = local_170._M_str;
                local_f8 = (ulong)((uint)local_150 & 7);
                local_110 = *(ulong *)&implicitNetNames->field_0x98;
                uVar13 = 0;
                cVar19 = cVar15;
                cVar20 = cVar16;
                cVar21 = cVar17;
                bVar22 = bVar18;
                cVar23 = cVar15;
                cVar24 = cVar16;
                cVar25 = cVar17;
                bVar26 = bVar18;
                cVar27 = cVar15;
                cVar28 = cVar16;
                cVar29 = cVar17;
                bVar30 = bVar18;
                local_100 = uVar11;
                do {
                  pcVar1 = (char *)(local_f0 + uVar11 * 0x10);
                  local_78 = *pcVar1;
                  cStack_77 = pcVar1[1];
                  cStack_76 = pcVar1[2];
                  bStack_75 = pcVar1[3];
                  cStack_74 = pcVar1[4];
                  cStack_73 = pcVar1[5];
                  cStack_72 = pcVar1[6];
                  bStack_71 = pcVar1[7];
                  cStack_70 = pcVar1[8];
                  cStack_6f = pcVar1[9];
                  cStack_6e = pcVar1[10];
                  bStack_6d = pcVar1[0xb];
                  cStack_6c = pcVar1[0xc];
                  cStack_6b = pcVar1[0xd];
                  cStack_6a = pcVar1[0xe];
                  bVar5 = pcVar1[0xf];
                  auVar14[0] = -(local_78 == cVar15);
                  auVar14[1] = -(cStack_77 == cVar16);
                  auVar14[2] = -(cStack_76 == cVar17);
                  auVar14[3] = -(bStack_75 == bVar18);
                  auVar14[4] = -(cStack_74 == cVar19);
                  auVar14[5] = -(cStack_73 == cVar20);
                  auVar14[6] = -(cStack_72 == cVar21);
                  auVar14[7] = -(bStack_71 == bVar22);
                  auVar14[8] = -(cStack_70 == cVar23);
                  auVar14[9] = -(cStack_6f == cVar24);
                  auVar14[10] = -(cStack_6e == cVar25);
                  auVar14[0xb] = -(bStack_6d == bVar26);
                  auVar14[0xc] = -(cStack_6c == cVar27);
                  auVar14[0xd] = -(cStack_6b == cVar28);
                  auVar14[0xe] = -(cStack_6a == cVar29);
                  auVar14[0xf] = -(bVar5 == bVar30);
                  uVar7 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
                  local_140 = uVar11;
                  bStack_69 = bVar5;
                  if (uVar7 != 0) {
                    lVar9 = local_e8 + uVar11 * 0xf0;
                    local_88 = cVar15;
                    cStack_87 = cVar16;
                    cStack_86 = cVar17;
                    bStack_85 = bVar18;
                    cStack_84 = cVar19;
                    cStack_83 = cVar20;
                    cStack_82 = cVar21;
                    bStack_81 = bVar22;
                    cStack_80 = cVar23;
                    cStack_7f = cVar24;
                    cStack_7e = cVar25;
                    bStack_7d = bVar26;
                    cStack_7c = cVar27;
                    cStack_7b = cVar28;
                    cStack_7a = cVar29;
                    bStack_79 = bVar30;
                    do {
                      iVar6 = 0;
                      if (uVar7 != 0) {
                        for (; (uVar7 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                        }
                      }
                      if ((__n == *(size_t *)(lVar9 + (ulong)(uint)(iVar6 << 4))) &&
                         ((implicitNetNames = local_160, __n == 0 ||
                          (iVar6 = bcmp(__s1,*(void **)(lVar9 + 8 + (ulong)(uint)(iVar6 << 4)),__n),
                          implicitNetNames = local_160, cVar15 = local_88, cVar16 = cStack_87,
                          cVar17 = cStack_86, bVar18 = bStack_85, cVar19 = cStack_84,
                          cVar20 = cStack_83, cVar21 = cStack_82, bVar22 = bStack_81,
                          cVar23 = cStack_80, cVar24 = cStack_7f, cVar25 = cStack_7e,
                          bVar26 = bStack_7d, cVar27 = cStack_7c, cVar28 = cStack_7b,
                          cVar29 = cStack_7a, bVar30 = bStack_79, iVar6 == 0)))) goto LAB_003bf3af;
                      uVar7 = uVar7 - 1 & uVar7;
                    } while (uVar7 != 0);
                  }
                  implicitNetNames = local_160;
                  if (((&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift)[local_f8] & bVar5) == 0) break;
                  lVar9 = local_140 + uVar13;
                  uVar13 = uVar13 + 1;
                  uVar11 = lVar9 + 1U & local_110;
                } while (uVar13 <= local_110);
                if (*(ulong *)&local_160->field_0xb8 < *(ulong *)&local_160->field_0xb0) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                  ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                            (&local_a0,
                             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                              *)this,local_130,local_100,local_150,&local_170);
                  puVar2 = &implicitNetNames->field_0xb8;
                  *(long *)puVar2 = *(long *)puVar2 + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                            (&local_a0,
                             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                              *)this,local_150,&local_170);
                }
                local_a0.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                              slang::ast::NetSymbol::createImplicit(local_118,local_148,local_120);
                slang::SmallVectorBase<slang::ast::Symbol_const*>::
                emplace_back<slang::ast::Symbol_const*>
                          ((SmallVectorBase<slang::ast::Symbol_const*> *)local_128,
                           (Symbol **)&local_a0);
LAB_003bf3af:
                pcVar10 = pcVar10 + 8;
              } while (pcVar10 != local_108);
            }
            instance = local_138;
            if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
              operator_delete(local_e0[0].data_);
              instance = local_138;
            }
          }
        }
        else if (SVar3 == NamedPortConnection) {
          lVar9 = 0x80;
          goto LAB_003bf11f;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_158);
    }
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, bitmask<InstanceFlags> flags,
                        SmallSet<std::string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    ASTContext ctx = context;
    if (flags.has(InstanceFlags::FromBind))
        ctx.flags |= ASTFlags::BindInstantiation;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<const IdentifierNameSyntax*> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, ctx, implicitNets);

        auto& comp = ctx.getCompilation();
        for (auto ins : implicitNets) {
            if (implicitNetNames.emplace(ins->identifier.valueText()).second)
                results.push_back(&NetSymbol::createImplicit(comp, *ins, netType));
        }
    }
}